

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O2

Index anurbs::Nurbs::
      lower_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *values,
                Index first,Index last,double value)

{
  Scalar *pSVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = last - first;
  while (uVar3 = uVar2, 0 < (long)uVar3) {
    uVar2 = uVar3 >> 1;
    pSVar1 = Eigen::
             DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
             ::operator[]((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                           *)values,first + uVar2);
    if (*pSVar1 <= value && value != *pSVar1) {
      first = first + uVar2 + 1;
      uVar2 = ~uVar2 + uVar3;
    }
  }
  return first;
}

Assistant:

static Index lower_bound(TKnots values, Index first, Index last, double value)
    {
        auto count = last - first;
        Index i, step;
    
        while (count > 0) {
            i = first; 
            step = count / 2; 
            i += step;
            if (values[i] < value) {
                first = ++i; 
                count -= step + 1; 
            } else {
                count = step;
            }
        }
        return first;
    }